

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionSet::SelectionSet(SelectionSet *this,vector<int,_std::allocator<int>_> *nbits)

{
  long lVar1;
  int i;
  long lVar2;
  _Bvector_base<std::allocator<bool>_> local_50;
  
  (this->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::resize
            (&this->bitsets_,6);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    OpenMDBitSet::OpenMDBitSet
              ((OpenMDBitSet *)&local_50,
               (long)(nbits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar2]);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((this->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1),
               (vector<bool,_std::allocator<bool>_> *)&local_50);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_50);
    lVar1 = lVar1 + 0x28;
  }
  clearAll(this);
  return;
}

Assistant:

SelectionSet::SelectionSet(std::vector<int> nbits) {
    bitsets_.resize(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i] = OpenMDBitSet(nbits[i]);
    clearAll();
  }